

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerator::InfoT::GetString(InfoT *this,string *key,string *value,bool required)

{
  bool bVar1;
  Value *this_00;
  string_view message;
  string_view message_00;
  String local_50;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isString(this_00);
  if (bVar1) {
    Json::Value::asString_abi_cxx11_(&local_50,this_00);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!required || value->_M_string_length != 0) {
      return true;
    }
    cmStrCat<std::__cxx11::string_const&,char_const(&)[11]>(&local_50,key,(char (*) [11])0x693ca4);
    message._M_str = local_50._M_dataplus._M_p;
    message._M_len = local_50._M_string_length;
    LogError(this,message);
  }
  else {
    bVar1 = Json::Value::isNull(this_00);
    if (bVar1 && !required) {
      return true;
    }
    cmStrCat<std::__cxx11::string_const&,char_const(&)[18]>(&local_50,key,(char (*) [18])0x693c58);
    message_00._M_str = local_50._M_dataplus._M_p;
    message_00._M_len = local_50._M_string_length;
    LogError(this,message_00);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return false;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetString(std::string const& key,
                                         std::string& value,
                                         bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (!jval.isString()) {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not a string."));
    }
  } else {
    value = jval.asString();
    if (value.empty() && required) {
      return this->LogError(cmStrCat(key, " is empty."));
    }
  }
  return true;
}